

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_stream.c
# Opt level: O1

mk_channel * mk_channel_new(int type,int fd)

{
  mk_channel *pmVar1;
  
  pmVar1 = (mk_channel *)malloc(0x38);
  if (pmVar1 != (mk_channel *)0x0) {
    if (pmVar1 == (mk_channel *)0x0) {
      pmVar1 = (mk_channel *)0x0;
    }
    else {
      pmVar1->type = type;
      pmVar1->fd = fd;
      pmVar1->status = 0;
      (pmVar1->streams).next = &pmVar1->streams;
      (pmVar1->streams).prev = &pmVar1->streams;
    }
    return pmVar1;
  }
  perror("malloc");
}

Assistant:

struct mk_channel *mk_channel_new(int type, int fd)
{
    struct mk_channel *channel;

    channel = mk_mem_alloc(sizeof(struct mk_channel));
    if (!channel) {
        return NULL;
    }
    channel->type   = type;
    channel->fd     = fd;
    channel->status = MK_CHANNEL_OK;
    mk_list_init(&channel->streams);

    return channel;
}